

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  value_type_conflict2 vVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  char *chars_1;
  _func_int_istream_ptr_path_ptr *processFunction;
  char *chars;
  ofstream outfile;
  big_int32_buf_t magic;
  ifstream in;
  int i;
  char **arg_fnames;
  path replace;
  path outFilename;
  path inFilename;
  char **in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  openmode in_stack_fffffffffffffa54;
  path *in_stack_fffffffffffffa58;
  code *pcVar6;
  basic_ofstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffa60;
  char **in_stack_fffffffffffffa78;
  path *in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffaa0;
  format fVar7;
  char **in_stack_fffffffffffffaa8;
  path *in_stack_fffffffffffffab0;
  undefined1 local_500 [40];
  char *local_4d8;
  code *local_4d0;
  char *local_4c8;
  undefined4 local_4bc;
  undefined1 local_4b8 [472];
  path *in_stack_fffffffffffffd20;
  ostream *in_stack_fffffffffffffd28;
  istream *in_stack_fffffffffffffd30;
  char local_2b4 [4];
  long local_2b0 [10];
  path *in_stack_fffffffffffffda0;
  ostream *in_stack_fffffffffffffda8;
  istream *in_stack_fffffffffffffdb0;
  int local_94;
  path local_38;
  long local_10;
  int local_8;
  openmode local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::filesystem::__cxx11::path::path
            ((path *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  std::filesystem::__cxx11::path::path
            ((path *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  std::filesystem::__cxx11::path::path
            ((path *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
  for (local_94 = 1; fVar7 = (format)((ulong)in_stack_fffffffffffffaa0 >> 0x38), local_94 < local_8;
      local_94 = local_94 + 1) {
    iVar3 = strcmp(*(char **)(local_10 + (long)local_94 * 8),"-bup-parts");
    if (iVar3 == 0) {
      SAVE_BUP_AS_PARTS = true;
    }
    else {
      iVar3 = strcmp(*(char **)(local_10 + (long)local_94 * 8),"-debug-images");
      if (iVar3 == 0) {
        local_94 = local_94 + 1;
        if (local_8 <= local_94) {
          usage(in_stack_fffffffffffffa54,in_stack_fffffffffffffa48);
        }
        std::filesystem::__cxx11::path::operator=
                  (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
        SHOULD_WRITE_DEBUG_IMAGES = true;
      }
      else {
        iVar3 = strcmp(*(char **)(local_10 + (long)local_94 * 8),"-replace");
        if (iVar3 == 0) {
          local_94 = local_94 + 1;
          if (local_8 <= local_94) {
            usage(in_stack_fffffffffffffa54,in_stack_fffffffffffffa48);
          }
          std::filesystem::__cxx11::path::operator=
                    (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
        }
        else {
          bVar1 = std::filesystem::__cxx11::path::empty((path *)0x135c5d);
          if (bVar1) {
            std::filesystem::__cxx11::path::operator=
                      (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
          }
          else {
            bVar1 = std::filesystem::__cxx11::path::empty((path *)0x135c95);
            if (bVar1) {
              std::filesystem::__cxx11::path::operator=
                        (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
            }
            else {
              usage(in_stack_fffffffffffffa54,in_stack_fffffffffffffa48);
            }
          }
        }
      }
    }
  }
  bVar1 = std::filesystem::__cxx11::path::empty((path *)0x135d05);
  if ((bVar1) || (bVar1 = std::filesystem::__cxx11::path::empty((path *)0x135d16), bVar1)) {
    usage(in_stack_fffffffffffffa54,in_stack_fffffffffffffa48);
  }
  std::filesystem::__cxx11::path::operator=(&currentFileName_abi_cxx11_,&local_38);
  std::ifstream::ifstream(local_2b0,*(char **)(local_10 + 8),_S_bin);
  bVar2 = std::ios::operator!((ios *)((long)local_2b0 + *(long *)(local_2b0[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::istream::read((char *)local_2b0,(long)local_2b4);
    std::istream::seekg((long)local_2b0,_S_beg);
    bVar1 = std::filesystem::__cxx11::path::empty((path *)0x135e4e);
    if (bVar1) {
      vVar4 = boost::endian::
              endian_buffer<(boost::endian::order)0,_int,_32UL,_(boost::endian::align)0>::value
                        ((endian_buffer<(boost::endian::order)0,_int,_32UL,_(boost::endian::align)0>
                          *)0x136078);
      if (vVar4 == 0x42555034) {
        local_4d0 = processBup;
      }
      else if (vVar4 == 0x4d534b33) {
        local_4d0 = processMsk3;
      }
      else if (vVar4 == 0x4d534b34) {
        local_4d0 = processMsk4;
      }
      else if (vVar4 == 0x50494334) {
        local_4d0 = processPic;
      }
      else {
        if (vVar4 != 0x54584134) {
          local_4d8 = local_2b4;
          poVar5 = std::operator<<((ostream *)&std::cerr,*(char **)(local_10 + 8));
          poVar5 = std::operator<<(poVar5,": unknown magic: \'");
          poVar5 = std::operator<<(poVar5,*local_4d8);
          poVar5 = std::operator<<(poVar5,local_4d8[1]);
          poVar5 = std::operator<<(poVar5,local_4d8[2]);
          poVar5 = std::operator<<(poVar5,local_4d8[3]);
          poVar5 = std::operator<<(poVar5,"\'");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        local_4d0 = processTxa;
      }
      pcVar6 = local_4d0;
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,fVar7);
      in_stack_fffffffffffffa54 = (*pcVar6)(local_2b0,local_500);
      local_4 = in_stack_fffffffffffffa54;
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
      local_4bc = 1;
    }
    else {
      std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa54);
      vVar4 = boost::endian::
              endian_buffer<(boost::endian::order)0,_int,_32UL,_(boost::endian::align)0>::value
                        ((endian_buffer<(boost::endian::order)0,_int,_32UL,_(boost::endian::align)0>
                          *)0x135e7f);
      if (vVar4 == 0x50494334) {
        local_4 = replacePic(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                             in_stack_fffffffffffffd20);
      }
      else if (vVar4 == 0x54584134) {
        local_4 = replaceTxa(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                             in_stack_fffffffffffffda0);
      }
      else {
        local_4c8 = local_2b4;
        poVar5 = std::operator<<((ostream *)&std::cerr,*(char **)(local_10 + 8));
        poVar5 = std::operator<<(poVar5,": file type \'");
        poVar5 = std::operator<<(poVar5,*local_4c8);
        poVar5 = std::operator<<(poVar5,local_4c8[1]);
        poVar5 = std::operator<<(poVar5,local_4c8[2]);
        poVar5 = std::operator<<(poVar5,local_4c8[3]);
        poVar5 = std::operator<<(poVar5,"\' unsupported by replace");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_4 = _S_app;
      }
      local_4bc = 1;
      std::ofstream::~ofstream(local_4b8);
    }
    std::ifstream::~ifstream(local_2b0);
    std::filesystem::__cxx11::path::~path
              ((path *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    std::filesystem::__cxx11::path::~path
              ((path *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    std::filesystem::__cxx11::path::~path
              ((path *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    return local_4;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to open file ");
  poVar5 = std::operator<<(poVar5,*(char **)(local_10 + 8));
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int main(int argc, const char **argv) {
	fs::path inFilename, outFilename, replace;
#ifdef _WIN32
	int wargc;
	LPWSTR* wargv = CommandLineToArgvW(GetCommandLineW(), &wargc);
	LPWSTR* arg_fnames = wargv;
#else
	const char** arg_fnames = argv;
#endif
	for (int i = 1; i < argc; i++) {
		if (0 == strcmp(argv[i], "-bup-parts")) {
			SAVE_BUP_AS_PARTS = true;
		}
		else if (0 == strcmp(argv[i], "-debug-images")) {
			i++;
			if (i >= argc) {
				usage(argc, argv);
			}
			debugImagePath = arg_fnames[i];
			SHOULD_WRITE_DEBUG_IMAGES = true;
		}
		else if (0 == strcmp(argv[i], "-replace")) {
			i++;
			if (i >= argc) {
				usage(argc, argv);
			}
			replace = arg_fnames[i];
		}
		else if (inFilename.empty()) {
			inFilename = arg_fnames[i];
		}
		else if (outFilename.empty()) {
			outFilename = arg_fnames[i];
		}
		else {
			usage(argc, argv);
		}
	}
	if (inFilename.empty() || outFilename.empty()) {
		usage(argc,argv);
	}
	currentFileName = inFilename;

	std::ifstream in(argv[1], std::ios::binary);
	if (!in) {
		std::cerr << "Failed to open file " << argv[1] << std::endl;
		exit(EXIT_FAILURE);
	}

	boost::endian::big_int32_buf_t magic;
	
	in.read((char *)&magic, 4);
	in.seekg(0, in.beg);

	if (!replace.empty()) {
		fs::ofstream outfile(outFilename, std::ios::binary);
		switch (magic.value()) {
			case 'PIC4': return replacePic(in, outfile, replace);
			case 'TXA4': return replaceTxa(in, outfile, replace);
		}
		char *chars = (char *)&magic;
		std::cerr << argv[1] << ": file type '" << chars[0] << chars[1] << chars[2] << chars[3] << "' unsupported by replace" << std::endl;
		return EXIT_FAILURE;
	} else {
		int (*processFunction)(std::istream&, const fs::path&);
		switch (magic.value()) {
			case 'PIC4': processFunction = processPic; break;
			case 'BUP4': processFunction = processBup; break;
			case 'TXA4': processFunction = processTxa; break;
			case 'MSK3': processFunction = processMsk3; break;
			case 'MSK4': processFunction = processMsk4; break;
			default: {
				char *chars = (char *)&magic;
				std::cerr << argv[1] << ": unknown magic: '" << chars[0] << chars[1] << chars[2] << chars[3] << "'" << std::endl;
				exit(EXIT_FAILURE);
			}
		}
		return processFunction(in, argv[2]);
	}
}